

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O1

void __thiscall
pstore::broker::command_processor::gc(command_processor *this,fifo_path *param_1,broker_command *c)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  long *plVar4;
  ostringstream os;
  string local_1d8;
  value_type local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  start_vacuum(&c->path);
  this->commits_ = this->commits_ + 1;
  bVar1 = brokerface::channel<pstore::descriptor_condition_variable>::have_listeners
                    ((channel<pstore::descriptor_condition_variable> *)commits_channel);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"{ \"commits\": ",0xd);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," }",2);
    std::__cxx11::stringbuf::str();
    bVar1 = json::is_valid(&local_1d8);
    if (!bVar1) {
      assert_failed("json::is_valid (str)",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/broker/command.cpp"
                    ,0x7a);
    }
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,local_1d8._M_dataplus._M_p,
               local_1d8._M_dataplus._M_p + local_1d8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_198);
    std::ios_base::~ios_base(local_128);
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)commits_channel);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    plVar4 = (long *)(commits_channel + 0x40);
    while (plVar4 = (long *)*plVar4, plVar4 != (long *)0x0) {
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)plVar4[1],&local_1b8);
    }
    descriptor_condition_variable::notify_all
              ((descriptor_condition_variable *)commits_channel._40_8_);
    pthread_mutex_unlock((pthread_mutex_t *)commits_channel);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void command_processor::gc (brokerface::fifo_path const &, broker_command const & c) {
            start_vacuum (c.path);

            ++commits_;
            commits_channel.publish ([this] () {
                std::ostringstream os;
                os << "{ \"commits\": " << commits_ << " }";
                std::string const & str = os.str ();
                PSTORE_ASSERT (json::is_valid (str));
                return str;
            });
        }